

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::WildcardPattern::adjustCase(WildcardPattern *this,string *str)

{
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  
  if (*(int *)(in_RSI + 8) == 1) {
    toLower(in_RDI);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
  }
  return in_RDI;
}

Assistant:

std::string WildcardPattern::adjustCase( std::string const& str ) const {
        return m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str;
    }